

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionID.h
# Opt level: O0

void __thiscall FIX::SessionID::fromString(SessionID *this,string *str)

{
  string local_260 [32];
  STRING local_240;
  TargetCompID local_220;
  STRING local_1c0;
  TargetCompID local_1a0;
  STRING local_140;
  SenderCompID local_120;
  STRING local_b0;
  BeginString local_90;
  size_type local_30;
  size_type third;
  size_type second;
  size_type first;
  string *str_local;
  SessionID *this_local;
  
  first = (size_type)str;
  str_local = (string *)this;
  second = std::__cxx11::string::find_first_of((char)str,0x3a);
  third = std::__cxx11::string::find((char *)first,0x3e01d7);
  local_30 = std::__cxx11::string::find_last_of((char)first,0x3a);
  if ((second != 0xffffffffffffffff) && (third != 0xffffffffffffffff)) {
    std::__cxx11::string::substr((ulong)&local_b0,first);
    BeginString::BeginString(&local_90,&local_b0);
    BeginString::operator=(&this->m_beginString,&local_90);
    BeginString::~BeginString(&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::substr((ulong)&local_140,first);
    SenderCompID::SenderCompID(&local_120,&local_140);
    SenderCompID::operator=(&this->m_senderCompID,&local_120);
    SenderCompID::~SenderCompID(&local_120);
    std::__cxx11::string::~string((string *)&local_140);
    if (second == local_30) {
      std::__cxx11::string::substr((ulong)&local_1c0,first);
      TargetCompID::TargetCompID(&local_1a0,&local_1c0);
      TargetCompID::operator=(&this->m_targetCompID,&local_1a0);
      TargetCompID::~TargetCompID(&local_1a0);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::__cxx11::string::operator=((string *)&this->m_sessionQualifier,"");
    }
    else {
      std::__cxx11::string::substr((ulong)&local_240,first);
      TargetCompID::TargetCompID(&local_220,&local_240);
      TargetCompID::operator=(&this->m_targetCompID,&local_220);
      TargetCompID::~TargetCompID(&local_220);
      std::__cxx11::string::~string((string *)&local_240);
      std::__cxx11::string::substr((ulong)local_260,first);
      std::__cxx11::string::operator=((string *)&this->m_sessionQualifier,local_260);
      std::__cxx11::string::~string(local_260);
    }
    toString(this,&this->m_frozenString);
  }
  return;
}

Assistant:

void fromString( const std::string& str )
  {
    std::string::size_type first =
      str.find_first_of(':');
    std::string::size_type second =
      str.find("->");
    std::string::size_type third =
      str.find_last_of(':');
    if( first == std::string::npos )
      return;
    if( second == std::string::npos )
      return;
    m_beginString = str.substr(0, first);
    m_senderCompID = str.substr(first+1, second - first - 1);
    if( first == third )
    {
      m_targetCompID = str.substr(second+2);
      m_sessionQualifier = "";
    }
    else
    {
      m_targetCompID = str.substr(second+2, third - second - 2);
      m_sessionQualifier = str.substr(third+1);
    }
    toString(m_frozenString);
  }